

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,
               MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>_>
               *src,assign_op<double,_double> *func)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  Index size;
  ulong uVar8;
  long lVar9;
  RhsNested *xpr;
  SrcEvaluatorType srcEvaluator;
  product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_40;
  product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_28;
  
  product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator(&local_40,(XprType *)src);
  xpr = &(src->m_expression).m_rhs;
  product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator(&local_28,&xpr->m_expression);
  uVar8 = (((xpr->m_expression).m_lhs)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar8) {
    if ((long)uVar8 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)dst,uVar8,uVar8,1);
  }
  uVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar4 != uVar8) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>>>, T1 = double, T2 = double]"
                 );
  }
  pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar8 = uVar4 - ((long)uVar4 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar4) {
    lVar9 = 0;
    do {
      pdVar1 = (double *)
               ((long)local_40.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      .m_d.data + lVar9 * 8);
      dVar6 = pdVar1[1];
      pdVar2 = (double *)
               ((long)local_28.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      .m_d.data + lVar9 * 8);
      dVar7 = pdVar2[1];
      pdVar3 = pdVar5 + lVar9;
      *pdVar3 = *pdVar1 * *pdVar2;
      pdVar3[1] = dVar6 * dVar7;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar4) {
    do {
      pdVar5[uVar8] =
           *(double *)
            ((long)local_40.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   .m_d.data + uVar8 * 8) *
           *(double *)
            ((long)local_28.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   .m_d.data + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  free(local_28.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_40.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}